

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t rar5_cleanup(archive_read *a)

{
  rar5 *rar;
  size_t *__ptr;
  
  rar = (rar5 *)a->format->data;
  free((rar->cstate).window_buf);
  free((rar->cstate).filtered_buf);
  (rar->cstate).dready[1].size = 0;
  (rar->cstate).dready[1].offset = 0;
  *(undefined8 *)((rar->cstate).dready + 1) = 0;
  (rar->cstate).dready[1].buf = (uint8_t *)0x0;
  (rar->cstate).dready[0].size = 0;
  (rar->cstate).dready[0].offset = 0;
  *(undefined8 *)(rar->cstate).dready = 0;
  (rar->cstate).dready[0].buf = (uint8_t *)0x0;
  free((rar->vol).push_buf);
  free_filters(rar);
  __ptr = (rar->cstate).filters.arr;
  if (__ptr != (size_t *)0x0) {
    free(__ptr);
    (rar->cstate).filters.arr = (size_t *)0x0;
    (rar->cstate).filters.beg_pos = 0xffff;
    (rar->cstate).filters.end_pos = 0xffff;
    (rar->cstate).filters.cap_mask = 0;
  }
  free(rar);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int rar5_cleanup(struct archive_read *a) {
	struct rar5* rar = get_context(a);

	free(rar->cstate.window_buf);
	free(rar->cstate.filtered_buf);
	clear_data_ready_stack(rar);

	free(rar->vol.push_buf);

	free_filters(rar);
	cdeque_free(&rar->cstate.filters);

	free(rar);
	a->format->data = NULL;

	return ARCHIVE_OK;
}